

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O0

void __thiscall
libguarded::
rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::
push_back(rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
          *this,SignalBase *data)

{
  __pointer_type __p;
  pointer pnVar1;
  SignalBase **in_RCX;
  node *oldTail;
  unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  newNode;
  SignalBase *data_local;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *this_local;
  
  newNode._M_t.
  super___uniq_ptr_impl<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  .
  super__Head_base<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_false>
  ._M_head_impl = (node *)data;
  detail::
  allocate_unique<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::node,std::allocator<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::node>,CsSignal::SignalBase_const*>
            ((unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
              *)&oldTail,(detail *)&this->field_0x40,
             (allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>
              *)&newNode._M_t.
                 super___uniq_ptr_impl<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
                 .
                 super__Head_base<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_false>
             ,in_RCX);
  __p = std::
        atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
        ::load(&this->m_tail,relaxed);
  if (__p == (__pointer_type)0x0) {
    pnVar1 = std::
             unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
             ::get((unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
                    *)&oldTail);
    std::
    atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
    ::store(&this->m_head,pnVar1,seq_cst);
    pnVar1 = std::
             unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
             ::release((unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
                        *)&oldTail);
    std::
    atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
    ::store(&this->m_tail,pnVar1,seq_cst);
  }
  else {
    pnVar1 = std::
             unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
             ::operator->((unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
                           *)&oldTail);
    std::
    atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
    ::store(&pnVar1->back,__p,seq_cst);
    pnVar1 = std::
             unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
             ::get((unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
                    *)&oldTail);
    std::
    atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
    ::store(&__p->next,pnVar1,seq_cst);
    pnVar1 = std::
             unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
             ::release((unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
                        *)&oldTail);
    std::
    atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
    ::store(&this->m_tail,pnVar1,seq_cst);
  }
  std::
  unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  ::~unique_ptr((unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
                 *)&oldTail);
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::push_back(T data)
{
   auto newNode = detail::allocate_unique<node>(m_node_alloc, std::move(data));

   node *oldTail = m_tail.load(std::memory_order_relaxed);

   if (oldTail == nullptr) {
      m_head.store(newNode.get());
      m_tail.store(newNode.release());
   } else {
      newNode->back.store(oldTail);
      oldTail->next.store(newNode.get());
      m_tail.store(newNode.release());
   }
}